

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

SoftHSM * SoftHSM::i(void)

{
  bool bVar1;
  pointer pSVar2;
  SoftHSM *this;
  pointer in_stack_ffffffffffffff98;
  SoftHSM *in_stack_ffffffffffffffa0;
  allocator *paVar3;
  SoftHSM *in_stack_ffffffffffffffc0;
  Configuration *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  pSVar2 = std::unique_ptr<SoftHSM,_std::default_delete<SoftHSM>_>::get
                     ((unique_ptr<SoftHSM,_std::default_delete<SoftHSM>_> *)
                      in_stack_ffffffffffffffa0);
  if (pSVar2 == (pointer)0x0) {
    this = (SoftHSM *)operator_new(0x90);
    SoftHSM(this);
    std::unique_ptr<SoftHSM,_std::default_delete<SoftHSM>_>::reset
              ((unique_ptr<SoftHSM,_std::default_delete<SoftHSM>_> *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
  }
  else {
    std::unique_ptr<SoftHSM,_std::default_delete<SoftHSM>_>::operator->
              ((unique_ptr<SoftHSM,_std::default_delete<SoftHSM>_> *)0x15b691);
    bVar1 = detectFork(in_stack_ffffffffffffffa0);
    if (bVar1) {
      Configuration::i();
      paVar3 = (allocator *)&stack0xffffffffffffffcf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,"library.reset_on_fork",paVar3);
      bVar1 = Configuration::getBool
                        (in_stack_ffffffffffffffc8,(string *)in_stack_ffffffffffffffc0,
                         SUB81((ulong)paVar3 >> 0x38,0));
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
      if (bVar1) {
        std::unique_ptr<SoftHSM,_std::default_delete<SoftHSM>_>::reset
                  ((unique_ptr<SoftHSM,_std::default_delete<SoftHSM>_> *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffa0 = (SoftHSM *)operator_new(0x90);
        SoftHSM(in_stack_ffffffffffffffc0);
        std::unique_ptr<SoftHSM,_std::default_delete<SoftHSM>_>::reset
                  ((unique_ptr<SoftHSM,_std::default_delete<SoftHSM>_> *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
      }
    }
  }
  pSVar2 = std::unique_ptr<SoftHSM,_std::default_delete<SoftHSM>_>::get
                     ((unique_ptr<SoftHSM,_std::default_delete<SoftHSM>_> *)
                      in_stack_ffffffffffffffa0);
  return pSVar2;
}

Assistant:

SoftHSM* SoftHSM::i()
{
	if (!instance.get())
	{
		instance.reset(new SoftHSM());
	}
	else if(instance->detectFork())
	{
		if (Configuration::i()->getBool("library.reset_on_fork", false))
		{
			/* It is important to first clear the singleton
			 * instance, and then fill it again, so make sure
			 * the old instance is first destroyed as some
			 * static structures are erased in the destructor.
			 */
			instance.reset(NULL);
			instance.reset(new SoftHSM());
		}
	}

	return instance.get();
}